

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db.cpp
# Opt level: O3

void __thiscall
Address_ExpandedNull_Test::~Address_ExpandedNull_Test(Address_ExpandedNull_Test *this)

{
  (this->super_Address).super_Test._vptr_Test = (_func_int **)&PTR__Address_001edc78;
  pstore::dump::address::default_expanded_ = (this->super_Address).old_expanded_;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F (Address, ExpandedNull) {
    using ::testing::ElementsAre;
    using namespace ::pstore::dump;

    address::set_expanded (true);
    value_ptr obj = make_value (pstore::address::null ());

    std::ostringstream out;
    obj->write (out);

    auto const lines = split_lines (out.str ());
    ASSERT_EQ (1U, lines.size ());
    EXPECT_THAT (split_tokens (lines.at (0)),
                 ElementsAre ("{", "segment:", "0x0,", "offset:", "0x0", "}"));
}